

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O1

optional<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_> * __thiscall
supermap::
Supermap<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
::getValue(optional<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_> *__return_storage_ptr__
          ,Supermap<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long>
           *this,Key<1UL> *k)

{
  ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long> *pEVar1;
  SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>
  *pSVar2;
  KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>
  *pKVar3;
  uint uVar4;
  code *pcVar5;
  _Head_base<0UL,_unsigned_char_*,_false> _Var6;
  char cVar7;
  ulong extraout_RDX;
  optional<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_> foundOnDisk;
  undefined1 local_70 [8];
  ByteArray<1UL> local_68;
  bool local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  code *local_28;
  code *local_20;
  
  pEVar1 = (this->innerStorage_)._M_t.
           super___uniq_ptr_impl<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_*,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_>_>
           .
           super__Head_base<0UL,_supermap::ExtractibleKeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>_*,_false>
           ._M_head_impl;
  uVar4 = (*(pEVar1->super_KeyValueStorage<supermap::Key<1UL>,_unsigned_long,_unsigned_long>).
            _vptr_KeyValueStorage[1])(pEVar1,k);
  if ((extraout_RDX & 1) == 0) {
    pSVar2 = (this->diskIndex_)._M_t.
             super___uniq_ptr_impl<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_*,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_>_>
             .
             super__Head_base<0UL,_supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>,_supermap::Key<1UL>_>_>_*,_false>
             ._M_head_impl;
    local_38 = 0;
    uStack_30 = 0;
    local_20 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:97:17)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:97:17)>
               ::_M_manager;
    local_58 = 0;
    uStack_50 = 0;
    local_40 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:98:17)>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(const_supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>_&,_const_supermap::Key<1UL>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Glebanister[P]supermap/src/core/Supermap.hpp:98:17)>
               ::_M_manager;
    (**(pSVar2->
       super_Findable<supermap::KeyValue<supermap::Key<1UL>,_unsigned_long>,_supermap::Key<1UL>_>).
       _vptr_Findable)(local_70,pSVar2,k);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    pcVar5 = local_28;
    if (local_28 != (code *)0x0) {
      pcVar5 = (code *)(*local_28)(&local_38,&local_38,3);
    }
    _Var6._M_head_impl = (uchar *)local_68;
    cVar7 = local_60;
    if (local_60 == false) {
      (__return_storage_ptr__->
      super__Optional_base<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_false,_false>).
      _M_payload.
      super__Optional_payload<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_true,_false,_false>
      .super__Optional_payload_base<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>.
      _M_engaged = false;
      _Var6._M_head_impl = (uchar *)pcVar5;
    }
  }
  else {
    _Var6._M_head_impl = (uchar *)(ulong)uVar4;
    cVar7 = '\x01';
  }
  if (cVar7 != '\0') {
    pKVar3 = (this->diskDataStorage_)._M_t.
             super___uniq_ptr_impl<supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_*,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_>_>
             .
             super__Head_base<0UL,_supermap::KeyValueShrinkableStorage<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<1UL>_>_>_>_*,_false>
             ._M_head_impl;
    (**(code **)(*(long *)&(pKVar3->
                           super_IndexedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_unsigned_long,_void>
                           ).
                           super_OrderedStorage<supermap::KeyValue<supermap::Key<1UL>,_supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>,_unsigned_long,_void>
                + 0x20))(local_70,pKVar3,_Var6._M_head_impl);
    (__return_storage_ptr__->
    super__Optional_base<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_true,_false,_false>
    .super__Optional_payload_base<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>.
    _M_payload._M_value.value.data_ =
         local_68.data_._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (__return_storage_ptr__->
    super__Optional_base<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_true,_false,_false>
    .super__Optional_payload_base<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>.
    _M_payload._M_value.removed = local_60;
    (__return_storage_ptr__->
    super__Optional_base<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_false,_false>).
    _M_payload.
    super__Optional_payload<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>,_true,_false,_false>
    .super__Optional_payload_base<supermap::MaybeRemovedValue<supermap::ByteArray<1UL>_>_>.
    _M_engaged = true;
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<Value> getValue(const Key &k) override {
        IndexT index;
        if (auto optIndex = innerStorage_->getValue(k); optIndex.has_value()) {
            index = optIndex.value();
        } else {
            std::optional<KeyIndex> foundOnDisk = diskIndex_->find(
                k,
                [](const KeyIndex &ki, const Key &key) { return ki.key < key; },
                [](const KeyIndex &ki, const Key &key) { return ki.key == key; }
            );
            if (!foundOnDisk.has_value()) {
                return std::nullopt;
            }
            index = foundOnDisk.value().value;
        }
        return std::optional{diskDataStorage_->get(index).value};
    }